

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingFileError_Test::
~DescriptorDatabaseTest_ConflictingFileError_Test
          (DescriptorDatabaseTest_ConflictingFileError_Test *this)

{
  DescriptorDatabaseTestCase *pDVar1;
  
  (this->super_DescriptorDatabaseTest).
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>.
  super_Test._vptr_Test = (_func_int **)&PTR__DescriptorDatabaseTest_018d32c8;
  (this->super_DescriptorDatabaseTest).
  super_TestWithParam<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>.
  super_WithParamInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
  ._vptr_WithParamInterface = (_func_int **)&PTR__DescriptorDatabaseTest_018d3308;
  pDVar1 = (this->super_DescriptorDatabaseTest).test_case_._M_t.
           super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
           .
           super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_false>
           ._M_head_impl;
  if (pDVar1 != (DescriptorDatabaseTestCase *)0x0) {
    (*pDVar1->_vptr_DescriptorDatabaseTestCase[1])();
  }
  (this->super_DescriptorDatabaseTest).test_case_._M_t.
  super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
  .
  super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_false>
  ._M_head_impl = (DescriptorDatabaseTestCase *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingFileError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
  AddToDatabaseWithError(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Bar\" "
      "}");
}